

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.c
# Opt level: O3

int main(void)

{
  _Bool _Var1;
  size_t size;
  bool bVar2;
  
  readme_pack();
  failure_rate_binary_fuse16();
  size = 1000;
  do {
    printf("== size = %zu \n");
    _Var1 = testbinaryfuse8(size,0);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbinaryfuse16(size,0);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbinaryfuse8pack(size,0);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbinaryfuse16pack(size,0);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbinaryfuse8(size,10);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbinaryfuse16(size,10);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbufferedxor8(size);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testbufferedxor16(size);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testxor8(size);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testxor16(size);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testxor8pack(size);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    _Var1 = testxor16pack(size);
    if (!_Var1) goto LAB_001081df;
    putchar(10);
    puts("======");
    bVar2 = size < 0xd06;
    size = size * 300;
  } while (bVar2);
  _Var1 = testbinaryfuse8(0,0);
  if (_Var1) {
    _Var1 = testbinaryfuse8(1,0);
    if (_Var1) {
      _Var1 = testbinaryfuse8(2,0);
      if (_Var1) {
        _Var1 = testbinaryfuse16(0,0);
        if (_Var1) {
          _Var1 = testbinaryfuse16(1,0);
          if (_Var1) {
            _Var1 = testbinaryfuse16(2,0);
            if (_Var1) {
              return 0;
            }
          }
        }
      }
    }
  }
LAB_001081df:
  abort();
}

Assistant:

int main() {
  readme_pack();
  failure_rate_binary_fuse16();
  for(size_t size = 1000; size <= 1000000; size *= 300) {
    printf("== size = %zu \n", size);
    if(!testbinaryfuse8(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse16(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse8pack(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse16pack(size, 0)) { abort(); }
    printf("\n");
    if(!testbinaryfuse8(size, 10)) { abort(); }
    printf("\n");
    if(!testbinaryfuse16(size, 10)) { abort(); }
    printf("\n");
    if(!testbufferedxor8(size)) { abort(); }
    printf("\n");
    if(!testbufferedxor16(size)) { abort(); }
    printf("\n");
    if(!testxor8(size)) { abort(); }
    printf("\n");
    if(!testxor16(size)) { abort(); }
    printf("\n");
    if(!testxor8pack(size)) { abort(); }
    printf("\n");
    if(!testxor16pack(size)) { abort(); }
    printf("\n");
    printf("======\n");
  }

  // test small edge-case binary fuse input sizes
  if(!testbinaryfuse8(0, 0)) { abort(); }
  if(!testbinaryfuse8(1, 0)) { abort(); }
  if(!testbinaryfuse8(2, 0)) { abort(); }
  if(!testbinaryfuse16(0, 0)) { abort(); }
  if(!testbinaryfuse16(1, 0)) { abort(); }
  if(!testbinaryfuse16(2, 0)) { abort(); }
}